

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O2

void __thiscall Assimp::Collada::Effect::Effect(Effect *this)

{
  _Rb_tree_header *p_Var1;
  
  this->mShadeType = Shade_Phong;
  (this->mEmissive).r = 0.0;
  (this->mEmissive).g = 0.0;
  (this->mEmissive).b = 0.0;
  (this->mEmissive).a = 1.0;
  (this->mAmbient).r = 0.1;
  (this->mAmbient).g = 0.1;
  (this->mAmbient).b = 0.1;
  (this->mAmbient).a = 1.0;
  (this->mDiffuse).r = 0.6;
  (this->mDiffuse).g = 0.6;
  (this->mDiffuse).b = 0.6;
  (this->mDiffuse).a = 1.0;
  (this->mSpecular).r = 0.4;
  (this->mSpecular).g = 0.4;
  (this->mSpecular).b = 0.4;
  (this->mSpecular).a = 1.0;
  (this->mTransparent).r = 0.0;
  (this->mTransparent).g = 0.0;
  (this->mTransparent).b = 0.0;
  (this->mTransparent).a = 1.0;
  (this->mReflective).r = 0.0;
  (this->mReflective).g = 0.0;
  (this->mReflective).b = 0.0;
  (this->mReflective).a = 0.0;
  Sampler::Sampler(&this->mTexEmissive);
  Sampler::Sampler(&this->mTexAmbient);
  Sampler::Sampler(&this->mTexDiffuse);
  Sampler::Sampler(&this->mTexSpecular);
  Sampler::Sampler(&this->mTexTransparent);
  Sampler::Sampler(&this->mTexBump);
  Sampler::Sampler(&this->mTexReflective);
  this->mShininess = 10.0;
  this->mRefractIndex = 1.0;
  this->mReflectivity = 0.0;
  this->mTransparency = 1.0;
  this->mHasTransparency = false;
  this->mRGBTransparency = false;
  this->mInvertTransparency = false;
  p_Var1 = &(this->mParams)._M_t._M_impl.super__Rb_tree_header;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)((long)&(this->mParams)._M_t._M_impl.super__Rb_tree_header._M_node_count + 7) = 0;
  return;
}

Assistant:

Effect()
        : mShadeType    (Shade_Phong)
        , mEmissive     ( 0, 0, 0, 1)
        , mAmbient      ( 0.1f, 0.1f, 0.1f, 1)
        , mDiffuse      ( 0.6f, 0.6f, 0.6f, 1)
        , mSpecular     ( 0.4f, 0.4f, 0.4f, 1)
        , mTransparent  ( 0, 0, 0, 1)
        , mShininess    (10.0f)
        , mRefractIndex (1.f)
        , mReflectivity (0.f)
        , mTransparency (1.f)
        , mHasTransparency (false)
        , mRGBTransparency(false)
        , mInvertTransparency(false)
        , mDoubleSided  (false)
        , mWireframe    (false)
        , mFaceted      (false)
    {
    }